

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::LoopControlException::LoopControlException
          (LoopControlException *this,LoopControlType control_type)

{
  char *__lhs;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38," outside of a loop",&local_59);
  __lhs = "break";
  if (control_type == Continue) {
    __lhs = "continue";
  }
  std::operator+(&local_58,__lhs,&local_38);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__runtime_error_0022b860;
  this->control_type = control_type;
  return;
}

Assistant:

LoopControlException(LoopControlType control_type)
      : std::runtime_error((control_type == LoopControlType::Continue ? "continue" : "break") + std::string(" outside of a loop")),
        control_type(control_type) {}